

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser.cc
# Opt level: O2

bool __thiscall DyndepParser::Parse(DyndepParser *this,string *filename,string *input,string *err)

{
  Lexer *this_00;
  StringPiece filename_00;
  StringPiece input_00;
  bool bVar1;
  bool bVar2;
  Token t;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  allocator<char> local_71;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &(this->super_Parser).lexer_;
  filename_00.str_ = (filename->_M_dataplus)._M_p;
  filename_00.len_ = filename->_M_string_length;
  input_00.str_ = (input->_M_dataplus)._M_p;
  input_00.len_ = input->_M_string_length;
  Lexer::Start(this_00,filename_00,input_00);
  bVar2 = false;
switchD_0010d5a0_caseD_8:
  t = Lexer::ReadToken(this_00);
  switch(t) {
  case ERROR:
    break;
  case BUILD:
    if (!bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"expected \'ninja_dyndep_version = ...\'",
                 (allocator<char> *)&local_50);
      bVar2 = Lexer::Error(this_00,&local_70,err);
      goto LAB_0010d6bb;
    }
    bVar1 = ParseEdge(this,err);
LAB_0010d5b7:
    if (bVar1 == false) {
      return false;
    }
    goto switchD_0010d5a0_caseD_8;
  case COLON:
  case DEFAULT:
  case EQUALS:
  case INCLUDE:
  case INDENT:
    goto switchD_0010d5a0_caseD_2;
  case IDENT:
    Lexer::UnreadToken(this_00);
    if (!bVar2) {
      bVar1 = ParseDyndepVersion(this,err);
      bVar2 = true;
      goto LAB_0010d5b7;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"unexpected ",&local_71);
    pcVar3 = Lexer::TokenName(IDENT);
    std::operator+(&local_70,&local_50,pcVar3);
    bVar2 = Lexer::Error(this_00,&local_70,err);
    goto LAB_0010d65e;
  case NEWLINE:
    goto switchD_0010d5a0_caseD_8;
  default:
    if (t == TEOF) {
      if (bVar2) {
        return true;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"expected \'ninja_dyndep_version = ...\'",
                 (allocator<char> *)&local_50);
      bVar2 = Lexer::Error(this_00,&local_70,err);
      goto LAB_0010d6bb;
    }
switchD_0010d5a0_caseD_2:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"unexpected ",&local_71);
    pcVar3 = Lexer::TokenName(t);
    std::operator+(&local_70,&local_50,pcVar3);
    bVar2 = Lexer::Error(this_00,&local_70,err);
LAB_0010d65e:
    std::__cxx11::string::~string((string *)&local_70);
    this_01 = &local_50;
    goto LAB_0010d6c2;
  }
  Lexer::DescribeLastError_abi_cxx11_(&local_70,this_00);
  bVar2 = Lexer::Error(this_00,&local_70,err);
LAB_0010d6bb:
  this_01 = &local_70;
LAB_0010d6c2:
  std::__cxx11::string::~string((string *)this_01);
  return bVar2;
}

Assistant:

bool DyndepParser::Parse(const string& filename, const string& input,
                         string* err) {
  lexer_.Start(filename, input);

  // Require a supported ninja_dyndep_version value immediately so
  // we can exit before encountering any syntactic surprises.
  bool haveDyndepVersion = false;

  for (;;) {
    Lexer::Token token = lexer_.ReadToken();
    switch (token) {
    case Lexer::BUILD: {
      if (!haveDyndepVersion)
        return lexer_.Error("expected 'ninja_dyndep_version = ...'", err);
      if (!ParseEdge(err))
        return false;
      break;
    }
    case Lexer::IDENT: {
      lexer_.UnreadToken();
      if (haveDyndepVersion)
        return lexer_.Error(string("unexpected ") + Lexer::TokenName(token),
                            err);
      if (!ParseDyndepVersion(err))
        return false;
      haveDyndepVersion = true;
      break;
    }
    case Lexer::ERROR:
      return lexer_.Error(lexer_.DescribeLastError(), err);
    case Lexer::TEOF:
      if (!haveDyndepVersion)
        return lexer_.Error("expected 'ninja_dyndep_version = ...'", err);
      return true;
    case Lexer::NEWLINE:
      break;
    default:
      return lexer_.Error(string("unexpected ") + Lexer::TokenName(token),
                          err);
    }
  }
  return false;  // not reached
}